

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupTrimmed2(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManCreateRefs(p);
  for (iVar6 = 0; iVar6 < p->vCos->nSize - p->nRegs; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCo(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
    p->pRefs[iVar1] = p->pRefs[iVar1] + -1;
  }
  for (iVar6 = 0; iVar6 < p->vCis->nSize - p->nRegs; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCi(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjRefNum(p,pGVar4);
    if (iVar1 != 0) break;
  }
  if (p->vCis->nSize - p->nRegs == iVar6) {
    Gia_ManAppendCi(p_00);
  }
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCi(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjRefNum(p,pGVar4);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsRo(p,pGVar4);
      if (iVar1 != 0) goto LAB_001da638;
    }
    else {
LAB_001da638:
      uVar2 = Gia_ManAppendCi(p_00);
      pGVar4->Value = uVar2;
    }
  }
  for (iVar6 = 0; iVar6 < p->nObjs; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManObj(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar1 = Gia_ObjFanin0Copy(pGVar4);
      iLit1 = Gia_ObjFanin1Copy(pGVar4);
      uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
      pGVar4->Value = uVar2;
    }
  }
  for (iVar6 = 0; iVar6 < p->vCos->nSize - p->nRegs; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCo(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar5 = (ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff);
    if ((~*(ulong *)(pGVar4 + -uVar5) & 0x1fffffff1fffffff) != 0) {
      iVar1 = Gia_ObjIsPi(p,pGVar4 + -uVar5);
      if (iVar1 == 0) break;
    }
  }
  if (p->vCos->nSize - p->nRegs == iVar6) {
    Gia_ManAppendCo(p_00,0);
  }
  for (iVar6 = 0; iVar6 < p->vCos->nSize; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCo(p,iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar5 = (ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff);
    if ((~*(ulong *)(pGVar4 + -uVar5) & 0x1fffffff1fffffff) == 0) {
LAB_001da75e:
      iVar1 = Gia_ObjIsRi(p,pGVar4);
      if (iVar1 != 0) goto LAB_001da76d;
    }
    else {
      iVar1 = Gia_ObjIsPi(p,pGVar4 + -uVar5);
      if (iVar1 != 0) goto LAB_001da75e;
LAB_001da76d:
      iVar1 = Gia_ObjFanin0Copy(pGVar4);
      Gia_ManAppendCo(p_00,iVar1);
    }
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  iVar6 = Gia_ManHasDangling(p_00);
  if (iVar6 == 0) {
    return p_00;
  }
  __assert_fail("!Gia_ManHasDangling( pNew )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                ,0x8f7,"Gia_Man_t *Gia_ManDupTrimmed2(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupTrimmed2( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // check if there are PIs to be added
    Gia_ManCreateRefs( p );
    // discount references of POs
    Gia_ManForEachPo( p, pObj, i )
        Gia_ObjRefFanin0Dec( p, pObj );
    // check if PIs are left
    Gia_ManForEachPi( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) )
            break;
    if ( i == Gia_ManPiNum(p) ) // there is no PIs - add dummy PI
        Gia_ManAppendCi(pNew);
    // add the ROs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) || Gia_ObjIsRo(p, pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // check if there are POs to be added
    Gia_ManForEachPo( p, pObj, i )
        if ( !Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && !Gia_ObjIsPi(p, Gia_ObjFanin0(pObj)) )
            break;
    if ( i == Gia_ManPoNum(p) ) // there is no POs - add dummy PO
        Gia_ManAppendCo( pNew, 0 );
    Gia_ManForEachCo( p, pObj, i )
        if ( (!Gia_ObjIsConst0(Gia_ObjFanin0(pObj)) && !Gia_ObjIsPi(p, Gia_ObjFanin0(pObj))) || Gia_ObjIsRi(p, pObj) )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    assert( !Gia_ManHasDangling( pNew ) );
    return pNew;
}